

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

_Bool tb_lookup_cmp(uc_struct_conflict15 *uc,void *p,void *d)

{
  tb_page_addr_t tVar1;
  
  if ((((*p == *d) && (*(long *)((long)p + 0x40) == *(long *)((long)d + 0x10))) &&
      (*(int *)((long)p + 4) == *(int *)((long)d + 4))) &&
     (((*(int *)((long)p + 8) == *(int *)((long)d + 0x18) &&
       (*(int *)((long)p + 0x14) == *(int *)((long)d + 0x20))) &&
      ((*(uint *)((long)p + 0x10) & 0xff0effff) == *(uint *)((long)d + 0x1c))))) {
    if (*(long *)((long)p + 0x48) == -1) {
      return true;
    }
    tVar1 = get_page_addr_code_tricore
                      (*(CPUArchState_conflict30 **)((long)d + 8),(*d & 0xffffc000) + 0x4000);
    if (*(tb_page_addr_t *)((long)p + 0x48) == tVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool tb_lookup_cmp(struct uc_struct *uc, const void *p, const void *d)
{
    const TranslationBlock *tb = p;
    const struct tb_desc *desc = d;

    if (tb->pc == desc->pc &&
        tb->page_addr[0] == desc->phys_page1 &&
        tb->cs_base == desc->cs_base &&
        tb->flags == desc->flags &&
        tb->trace_vcpu_dstate == desc->trace_vcpu_dstate &&
        (tb_cflags(tb) & (CF_HASH_MASK | CF_INVALID)) == desc->cf_mask) {
        /* check next page if needed */
        if (tb->page_addr[1] == -1) {
            return true;
        } else {
            tb_page_addr_t phys_page2;
            target_ulong virt_page2;

            virt_page2 = (desc->pc & TARGET_PAGE_MASK) + TARGET_PAGE_SIZE;
            phys_page2 = get_page_addr_code(desc->env, virt_page2);
            if (tb->page_addr[1] == phys_page2) {
                return true;
            }
        }
    }
    return false;
}